

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jediorder_wang_test.cc
# Opt level: O1

int main(int param_1,char **argv)

{
  undefined8 uVar1;
  char cVar2;
  istream *piVar3;
  ostream *poVar4;
  ulong uVar5;
  uint uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> results;
  vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
  trees_collection;
  size_t single_value;
  CostModel ucm;
  string results_file_name;
  string input_file_name;
  LabelDictionary ld;
  BracketNotationParser<label::JSONLabel> bnp;
  WANG wang_algorithm;
  TreeIndexer ti1;
  ifstream results_file;
  TreeIndexer ti2;
  int local_92c;
  void *local_928;
  iterator iStack_920;
  unsigned_long *local_918;
  double local_910;
  vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_> local_908;
  ulong local_8f0;
  unsigned_long local_8e8;
  UnitCostModelJSON<label::JSONLabel> local_8e0;
  long *local_8d8 [2];
  long local_8c8 [2];
  string local_8b8;
  double local_898;
  double dStack_890;
  LabelDictionary<label::JSONLabel> local_888;
  BracketNotationParser<label::JSONLabel> local_830;
  WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON> local_770;
  TreeIndexJSON local_5c8;
  long local_400 [65];
  TreeIndexJSON local_1f8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b8,argv[1],(allocator<char> *)local_400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_8d8,argv[2],(allocator<char> *)local_400);
  local_888.label_to_id_dictionary_._M_h._M_buckets =
       &local_888.label_to_id_dictionary_._M_h._M_single_bucket;
  local_888.label_to_id_dictionary_._M_h._M_bucket_count = 1;
  local_888.label_to_id_dictionary_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_888.label_to_id_dictionary_._M_h._M_element_count = 0;
  local_888.label_to_id_dictionary_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_888.label_to_id_dictionary_._M_h._M_rehash_policy._M_next_resize = 0;
  local_888.label_to_id_dictionary_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_888.id_to_label_dictionary_.
  super__Vector_base<label::JSONLabel,_std::allocator<label::JSONLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_888.id_to_label_dictionary_.
  super__Vector_base<label::JSONLabel,_std::allocator<label::JSONLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_888.id_to_label_dictionary_.
  super__Vector_base<label::JSONLabel,_std::allocator<label::JSONLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_888.id_to_label_dictionary_.
  super__Vector_base<label::JSONLabel,_std::allocator<label::JSONLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_888._76_8_ = 0;
  local_8e0.ld_ = &local_888;
  local_770.
  super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>.c_ =
       &local_8e0;
  local_770.
  super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>.
  _vptr_JEDIAlgorithm = (_func_int **)&PTR_jedi_0010cd40;
  local_770.dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.df_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.df_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.df_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.e0_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.e0_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.e0_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.e_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.e_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.e_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.del_forest_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.del_forest_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.del_forest_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.del_tree_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.del_tree_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.del_tree_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.fav_child_dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.fav_child_dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.fav_child_dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.e_init_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.e_init_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.e_init_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.ins_f2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.ins_f2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.ins_t2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.ins_f2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.ins_t2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.ins_t2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.del_f1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_770.del_f1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.del_t1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_770.del_f1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.del_t1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_770.del_t1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_918 = (unsigned_long *)0x0;
  local_928 = (void *)0x0;
  iStack_920._M_current = (unsigned_long *)0x0;
  std::ifstream::ifstream((istream *)local_400,(string *)local_8d8,_S_in);
  local_8e8 = 0;
  local_5c8.super_Constants.tree_height_ = 0;
  local_5c8._12_4_ = 0;
  local_5c8.super_ListKR.list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  local_5c8.super_Constants._0_8_ = &local_5c8.super_ListKR;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_400[0] + -0x18));
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_400,(string *)&local_5c8,cVar2);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    __isoc99_sscanf(local_5c8.super_Constants._0_8_,"%zu",&local_8e8);
    if (iStack_920._M_current == local_918) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_928,iStack_920,
                 &local_8e8);
    }
    else {
      *iStack_920._M_current = local_8e8;
      iStack_920._M_current = iStack_920._M_current + 1;
    }
  }
  if ((ListKR *)local_5c8.super_Constants._0_8_ != &local_5c8.super_ListKR) {
    operator_delete((void *)local_5c8.super_Constants._0_8_,
                    CONCAT71(local_5c8.super_ListKR.list_kr_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             local_5c8.super_ListKR.list_kr_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_1_) + 1);
  }
  memset(&local_5c8.super_ListKR,0,0x180);
  local_5c8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count =
       1;
  local_5c8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin.
  _M_nxt = (_Hash_node_base *)0x0;
  local_5c8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_element_count
       = 0;
  local_5c8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  local_5c8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_next_resize = 0;
  local_5c8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_single_bucket
       = (__node_base_ptr)0x0;
  local_5c8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
       &local_5c8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
        _M_single_bucket;
  memset(&local_1f8.super_ListKR,0,0x180);
  local_1f8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count =
       1;
  local_1f8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin.
  _M_nxt = (_Hash_node_base *)0x0;
  local_1f8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_element_count
       = 0;
  local_1f8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  local_1f8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_next_resize = 0;
  local_1f8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_single_bucket
       = (__node_base_ptr)0x0;
  local_908.
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_908.
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_908.
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
       &local_1f8.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
        _M_single_bucket;
  parser::BracketNotationParser<label::JSONLabel>::BracketNotationParser(&local_830);
  parser::BracketNotationParser<label::JSONLabel>::parse_collection
            (&local_830,&local_908,&local_8b8);
  if (0x40 < (ulong)((long)local_908.
                           super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_908.
                          super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    local_92c = 0;
    uVar6 = 2;
    uVar5 = 1;
    do {
      node::
      index_tree<node::TreeIndexJSON,label::JSONLabel,cost_model::UnitCostModelJSON<label::JSONLabel>>
                (&local_5c8,
                 local_908.
                 super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,&local_888,&local_8e0);
      node::
      index_tree<node::TreeIndexJSON,label::JSONLabel,cost_model::UnitCostModelJSON<label::JSONLabel>>
                (&local_1f8,
                 local_908.
                 super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (uVar6 - 2),&local_888,&local_8e0);
      local_910 = json::
                  WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                  ::jedi(&local_770,&local_5c8,&local_1f8);
      uVar1 = *(undefined8 *)((long)local_928 + (ulong)(uVar6 - 2) * 8);
      dStack_890 = (double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25
      ;
      local_898 = dStack_890 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      local_8f0 = (ulong)uVar6;
      if ((local_910 != local_898) || (NAN(local_910) || NAN(local_898))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," ERROR Incorrect JediOrder for trees ",0x25);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        poVar4 = std::ostream::_M_insert<double>(local_910);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," instead of ",0xc);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        local_92c = -1;
        std::ostream::flush();
      }
      if ((local_910 != local_898) || (NAN(local_910) || NAN(local_898))) goto LAB_00102be2;
      uVar6 = uVar6 + 1;
      uVar5 = local_8f0;
    } while (local_8f0 <
             (ulong)((long)local_908.
                           super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_908.
                           super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  local_92c = 0;
LAB_00102be2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.kMatchRightBracket._M_dataplus._M_p != &local_830.kMatchRightBracket.field_2) {
    operator_delete(local_830.kMatchRightBracket._M_dataplus._M_p,
                    local_830.kMatchRightBracket.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.kMatchLeftBracket._M_dataplus._M_p != &local_830.kMatchLeftBracket.field_2) {
    operator_delete(local_830.kMatchLeftBracket._M_dataplus._M_p,
                    local_830.kMatchLeftBracket.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.kStructureElements._M_dataplus._M_p != &local_830.kStructureElements.field_2) {
    operator_delete(local_830.kStructureElements._M_dataplus._M_p,
                    local_830.kStructureElements.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.kRightBracket._M_dataplus._M_p != &local_830.kRightBracket.field_2) {
    operator_delete(local_830.kRightBracket._M_dataplus._M_p,
                    local_830.kRightBracket.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.kLeftBracket._M_dataplus._M_p != &local_830.kLeftBracket.field_2) {
    operator_delete(local_830.kLeftBracket._M_dataplus._M_p,
                    local_830.kLeftBracket.field_2._M_allocated_capacity + 1);
  }
  if (local_830.node_stack.
      super__Vector_base<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_830.node_stack.
                    super__Vector_base<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_830.node_stack.
                          super__Vector_base<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_830.node_stack.
                          super__Vector_base<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::~vector
            (&local_908);
  node::TreeIndexJSON::~TreeIndexJSON(&local_1f8);
  node::TreeIndexJSON::~TreeIndexJSON(&local_5c8);
  std::ifstream::~ifstream(local_400);
  if (local_928 != (void *)0x0) {
    operator_delete(local_928,(long)local_918 - (long)local_928);
  }
  json::WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
  ~WangTreeIndex(&local_770);
  std::vector<label::JSONLabel,_std::allocator<label::JSONLabel>_>::~vector
            (&local_888.id_to_label_dictionary_);
  std::
  _Hashtable<label::JSONLabel,_std::pair<const_label::JSONLabel,_int>,_std::allocator<std::pair<const_label::JSONLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::JSONLabel>,_std::hash<label::JSONLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<label::JSONLabel,_std::pair<const_label::JSONLabel,_int>,_std::allocator<std::pair<const_label::JSONLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::JSONLabel>,_std::hash<label::JSONLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_888);
  if (local_8d8[0] != local_8c8) {
    operator_delete(local_8d8[0],local_8c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  return local_92c;
}

Assistant:

int main(int, char** argv) {

  // Input file name.
  std::string input_file_name = std::string(argv[1]);
  // Input results file name.
  std::string results_file_name = std::string(argv[2]);

  // Type aliases.
  using Label = label::JSONLabel;
  using CostModel = cost_model::UnitCostModelJSON<Label>;
  using LabelDictionary = label::LabelDictionary<Label>;
  using TreeIndexer = node::TreeIndexJSON;
  using WANG = json::WangTreeIndex<CostModel, TreeIndexer>;
  
  // Initialize label dictionary - separate dictionary for each test tree
  // because it is easier to keep track of label ids.
  LabelDictionary ld;
  
  // Initialize cost model.
  CostModel ucm(ld);
  WANG wang_algorithm(ucm);
  
  // Read results from file.
  std::vector<size_t> results;
  std::ifstream results_file(results_file_name);
  std::size_t single_value = 0;
  for (std::string line; std::getline(results_file, line);) {
    sscanf(line.c_str(), "%zu", &single_value);
    results.push_back(single_value);
  }

  // Initialize two tree indexes.
  // Use TreeIndexAll that is a superset of all algorithms' indexes.
  TreeIndexer ti1;
  TreeIndexer ti2;

  // Create the container to store all trees.
  std::vector<node::Node<Label>> trees_collection;
  
  // Parse the dataset.
  parser::BracketNotationParser<Label> bnp;
  bnp.parse_collection(trees_collection, input_file_name);

  // iterate over all trees in the given collection
  for (unsigned int i = 1; i < trees_collection.size(); i++) {
    // Index input trees.
    node::index_tree(ti1, trees_collection[i], ld, ucm);
    node::index_tree(ti2, trees_collection[i-1], ld, ucm);

    // Compute the label intersection for two consecutive trees.
    double jediorder = wang_algorithm.jedi(ti1, ti2);

    // Verify the result against the given solution.
    if (jediorder != results[i - 1]) {
      std::cout << " ERROR Incorrect JediOrder for trees " << i << " and " 
          << i+1 << ": " << jediorder << " instead of " << results[i - 1] 
          << std::endl;
      return -1;
    }
  }
  
  return 0;
}